

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall sglr::rc::Texture3D::updateView(Texture3D *this,DepthStencilMode mode)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  int numLevels;
  Texture3DView local_38;
  
  uVar5 = (this->super_Texture).m_baseLevel;
  uVar6 = (ulong)uVar5;
  if ((uVar6 < 0xe) && ((this->m_levels).m_data[uVar6].m_cap != 0)) {
    bVar2 = isEmpty(&(this->m_levels).m_access[uVar6].super_ConstPixelBufferAccess);
    if (!bVar2) {
      if ((this->super_Texture).m_sampler.minFilter < NEAREST_MIPMAP_NEAREST) {
        numLevels = 1;
      }
      else {
        uVar4 = (this->m_levels).m_access[uVar6].super_ConstPixelBufferAccess.m_size.m_data[2];
        uVar1 = (this->m_levels).m_access[uVar6].super_ConstPixelBufferAccess.m_size.m_data[1];
        iVar3 = ((this->super_Texture).m_maxLevel - uVar5) + 1;
        if ((int)uVar4 < (int)uVar1) {
          uVar4 = uVar1;
        }
        uVar5 = (this->m_levels).m_access[uVar6].super_ConstPixelBufferAccess.m_size.m_data[0];
        if ((int)uVar4 < (int)uVar5) {
          uVar4 = uVar5;
        }
        uVar5 = 0x20;
        if (uVar4 != 0) {
          uVar5 = 0x1f;
          if (uVar4 != 0) {
            for (; uVar4 >> uVar5 == 0; uVar5 = uVar5 - 1) {
            }
          }
          uVar5 = uVar5 ^ 0x1f;
        }
        numLevels = 0x20 - uVar5;
        if (iVar3 < (int)(0x20 - uVar5)) {
          numLevels = iVar3;
        }
      }
      TextureLevelArray::updateSamplerMode(&this->m_levels,mode);
      tcu::Texture3DView::Texture3DView
                (&local_38,numLevels,(this->m_levels).m_effectiveAccess + uVar6);
      goto LAB_01520fa6;
    }
  }
  tcu::Texture3DView::Texture3DView(&local_38,0,(ConstPixelBufferAccess *)0x0);
LAB_01520fa6:
  (this->m_view).m_numLevels = local_38.m_numLevels;
  *(undefined4 *)&(this->m_view).field_0x4 = local_38._4_4_;
  *(undefined4 *)&(this->m_view).m_levels = local_38.m_levels._0_4_;
  *(undefined4 *)((long)&(this->m_view).m_levels + 4) = local_38.m_levels._4_4_;
  return;
}

Assistant:

void Texture3D::updateView (tcu::Sampler::DepthStencilMode mode)
{
	const int baseLevel	= getBaseLevel();

	if (hasLevel(baseLevel) && !isEmpty(getLevel(baseLevel)))
	{
		const int	width		= getLevel(baseLevel).getWidth();
		const int	height		= getLevel(baseLevel).getHeight();
		const int	depth		= getLevel(baseLevel).getDepth();
		const bool	isMipmap	= isMipmapFilter(getSampler().minFilter);
		const int	numLevels	= isMipmap ? de::min(getMaxLevel()-baseLevel+1, getNumMipLevels3D(width, height, depth)) : 1;

		m_levels.updateSamplerMode(mode);
		m_view = tcu::Texture3DView(numLevels, m_levels.getEffectiveLevels() + baseLevel);
	}
	else
		m_view = tcu::Texture3DView(0, DE_NULL);
}